

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void transaction_test(void)

{
  void *pvVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  fdb_kvs_handle *handle;
  fdb_kvs_handle *pfVar7;
  fdb_doc *pfVar8;
  ulong uVar9;
  char *pcVar10;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle *pfVar12;
  uint uVar13;
  fdb_doc *unaff_RBP;
  fdb_doc *unaff_R12;
  long lVar14;
  fdb_kvs_handle *unaff_R13;
  fdb_kvs_config *config;
  char *pcVar15;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_kvs_handle *db_txn1;
  fdb_file_handle *dbfile_txn1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_txn2;
  fdb_file_handle *dbfile_txn2;
  fdb_file_handle *dbfile_txn3;
  fdb_kvs_handle *db_txn3;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char keybuf [256];
  timeval __test_begin;
  char metabuf [256];
  fdb_config fconfig;
  fdb_iterator *pfStack_af0;
  fdb_doc *pfStack_ae8;
  fdb_kvs_handle *pfStack_ae0;
  timeval tStack_ad8;
  char acStack_ac8 [256];
  char acStack_9c8 [264];
  fdb_kvs_handle *pfStack_8c0;
  fdb_doc *pfStack_8b8;
  fdb_kvs_handle *pfStack_8b0;
  fdb_kvs_config *pfStack_8a8;
  fdb_kvs_handle *pfStack_8a0;
  fdb_doc *pfStack_898;
  fdb_kvs_handle *pfStack_888;
  undefined1 auStack_880 [16];
  fdb_kvs_handle *pfStack_870;
  fdb_kvs_handle *pfStack_868;
  fdb_file_handle *pfStack_860;
  hbtrie *phStack_858;
  btree *pbStack_850;
  fdb_kvs_config fStack_848;
  timeval tStack_830;
  undefined1 auStack_820 [512];
  fdb_config fStack_620;
  fdb_doc *pfStack_528;
  fdb_doc *pfStack_520;
  fdb_kvs_handle *pfStack_518;
  fdb_kvs_handle *pfStack_510;
  fdb_kvs_handle *pfStack_508;
  fdb_doc *pfStack_500;
  undefined1 local_4e8 [16];
  fdb_kvs_handle *local_4d8;
  fdb_file_handle *local_4d0;
  undefined1 local_4c8 [40];
  undefined1 local_4a0 [24];
  undefined1 local_488 [256];
  fdb_doc fStack_388;
  undefined1 local_338 [272];
  fdb_doc local_228 [3];
  fdb_config local_128;
  
  pfStack_500 = (fdb_doc *)0x116f6b;
  gettimeofday((timeval *)(local_338 + 0x100),(__timezone_ptr_t)0x0);
  pfStack_500 = (fdb_doc *)0x116f70;
  memleak_start();
  pfStack_500 = (fdb_doc *)0x116f7c;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_500 = (fdb_doc *)0x116f8c;
  fdb_get_default_config();
  pfVar11 = (fdb_kvs_handle *)local_4a0;
  pfStack_500 = (fdb_doc *)0x116f99;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.purging_interval = 0;
  local_128.compaction_threshold = '\0';
  pfVar7 = (fdb_kvs_handle *)local_4c8;
  pfStack_500 = (fdb_doc *)0x116fd2;
  fdb_open((fdb_file_handle **)pfVar7,"mvcc_test1",&local_128);
  pcVar10 = local_4e8 + 8;
  pfStack_500 = (fdb_doc *)0x116fe5;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_4c8._0_8_,(fdb_kvs_handle **)pcVar10,(fdb_kvs_config *)pfVar11
            );
  pfStack_500 = (fdb_doc *)0x116ffb;
  fVar2 = fdb_set_log_callback((fdb_kvs_handle *)local_4e8._8_8_,logCallbackFunc,"transaction_test")
  ;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f8f;
  pfStack_500 = (fdb_doc *)0x117025;
  fdb_open(&local_4d0,"mvcc_test1",&local_128);
  pfStack_500 = (fdb_doc *)0x117038;
  fdb_open((fdb_file_handle **)(local_4c8 + 0x10),"mvcc_test1",&local_128);
  pfStack_500 = (fdb_doc *)0x11704d;
  fdb_kvs_open_default(local_4d0,&local_4d8,(fdb_kvs_config *)local_4a0);
  pfStack_500 = (fdb_doc *)0x11705e;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_4c8._16_8_,(fdb_kvs_handle **)(local_4c8 + 8),
             (fdb_kvs_config *)local_4a0);
  pfStack_500 = (fdb_doc *)0x11706b;
  fdb_begin_transaction(local_4d0,'\x02');
  pfStack_500 = (fdb_doc *)0x117079;
  fdb_begin_transaction((fdb_file_handle *)local_4c8._16_8_,'\x02');
  lVar14 = 0;
  uVar9 = 0;
  do {
    pfStack_500 = (fdb_doc *)0x117099;
    sprintf(local_338,"key%d",uVar9 & 0xffffffff);
    pfStack_500 = (fdb_doc *)0x1170b1;
    sprintf((char *)local_228,"meta%d",uVar9 & 0xffffffff);
    pfStack_500 = (fdb_doc *)0x1170c6;
    sprintf(local_488,"body%d",uVar9 & 0xffffffff);
    pfStack_500 = (fdb_doc *)0x1170d9;
    sVar4 = strlen(local_338);
    pfStack_500 = (fdb_doc *)0x1170ec;
    sVar5 = strlen((char *)local_228);
    pfStack_500 = (fdb_doc *)0x1170f9;
    sVar6 = strlen(local_488);
    pfStack_500 = (fdb_doc *)0x11711b;
    fdb_doc_create((fdb_doc **)((long)&fStack_388.keylen + lVar14),local_338,sVar4,local_228,sVar5,
                   local_488,sVar6);
    pfStack_500 = (fdb_doc *)0x11712d;
    fdb_set(local_4d8,(fdb_doc *)(&fStack_388.keylen)[uVar9]);
    uVar9 = uVar9 + 1;
    lVar14 = lVar14 + 8;
  } while (uVar9 != 5);
  uVar9 = 5;
  unaff_R13 = (fdb_kvs_handle *)0x28;
  do {
    pfStack_500 = (fdb_doc *)0x117164;
    sprintf(local_338,"key%d",uVar9 & 0xffffffff);
    pfStack_500 = (fdb_doc *)0x11717c;
    sprintf((char *)local_228,"meta%d",uVar9 & 0xffffffff);
    pfStack_500 = (fdb_doc *)0x117191;
    sprintf(local_488,"body%d",uVar9 & 0xffffffff);
    unaff_R12 = (fdb_doc *)((long)unaff_R13 + (long)&fStack_388.keylen);
    pfStack_500 = (fdb_doc *)0x1171a4;
    sVar4 = strlen(local_338);
    pfStack_500 = (fdb_doc *)0x1171b7;
    sVar5 = strlen((char *)local_228);
    pfStack_500 = (fdb_doc *)0x1171c4;
    sVar6 = strlen(local_488);
    pfStack_500 = (fdb_doc *)0x1171e6;
    fdb_doc_create((fdb_doc **)unaff_R12,local_338,sVar4,local_228,sVar5,local_488,sVar6);
    pfStack_500 = (fdb_doc *)0x1171f8;
    fdb_set((fdb_kvs_handle *)local_4c8._8_8_,(fdb_doc *)(&fStack_388.keylen)[uVar9]);
    uVar9 = uVar9 + 1;
    unaff_R13 = (fdb_kvs_handle *)((long)unaff_R13 + 8);
  } while (uVar9 != 10);
  pcVar10 = "key%d";
  pfVar11 = (fdb_kvs_handle *)local_338;
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x11722e;
    sprintf((char *)pfVar11,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x117236;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x117254;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x117263;
    fVar2 = fdb_get(local_4d8,(fdb_doc *)local_4e8._0_8_);
    if ((uint)unaff_RBP < 5) {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f71;
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00117f76;
    pfStack_500 = (fdb_doc *)0x117283;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (uint)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x1172a6;
  fdb_open((fdb_file_handle **)(local_4c8 + 0x18),"mvcc_test1",&local_128);
  pfStack_500 = (fdb_doc *)0x1172b8;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_4c8._24_8_,(fdb_kvs_handle **)(local_4c8 + 0x20),
             (fdb_kvs_config *)local_4a0);
  pfStack_500 = (fdb_doc *)0x1172c5;
  fdb_begin_transaction((fdb_file_handle *)local_4c8._24_8_,'\x03');
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x1172ea;
    sprintf(local_338,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x1172f2;
    sVar4 = strlen(local_338);
    pfStack_500 = (fdb_doc *)0x117310;
    fdb_doc_create((fdb_doc **)local_4e8,local_338,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x11731f;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4c8._32_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_500 = (fdb_doc *)0x117ed9;
      transaction_test();
      goto LAB_00117ed9;
    }
    pfStack_500 = (fdb_doc *)0x117331;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x117344;
  fdb_end_transaction((fdb_file_handle *)local_4c8._24_8_,'\0');
  pfStack_500 = (fdb_doc *)0x11734e;
  fdb_close((fdb_file_handle *)local_4c8._24_8_);
  pfStack_500 = (fdb_doc *)0x11735a;
  fdb_end_transaction(local_4d0,'\0');
  pcVar10 = "key%d";
  pfVar11 = (fdb_kvs_handle *)local_338;
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x11737f;
    sprintf((char *)pfVar11,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x117387;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x1173a5;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x1173b4;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if ((uint)unaff_RBP < 5) {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f7b;
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00117f80;
    pfStack_500 = (fdb_doc *)0x1173d4;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (uint)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfVar11 = (fdb_kvs_handle *)local_338;
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x117400;
    sprintf((char *)pfVar11,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x117408;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x117426;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x117435;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4c8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117ed9;
    pfStack_500 = (fdb_doc *)0x117447;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x117458;
  fdb_abort_transaction((fdb_file_handle *)local_4c8._16_8_);
  pfStack_500 = (fdb_doc *)0x117465;
  fdb_close((fdb_file_handle *)local_4c8._0_8_);
  pfStack_500 = (fdb_doc *)0x11747c;
  fdb_open((fdb_file_handle **)local_4c8,"mvcc_test1",&local_128);
  pcVar10 = local_4e8 + 8;
  pfStack_500 = (fdb_doc *)0x117491;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_4c8._0_8_,(fdb_kvs_handle **)pcVar10,
             (fdb_kvs_config *)local_4a0);
  pfStack_500 = (fdb_doc *)0x1174a7;
  fVar2 = fdb_set_log_callback((fdb_kvs_handle *)local_4e8._8_8_,logCallbackFunc,"transaction_test")
  ;
  pcVar15 = (char *)unaff_R12;
  handle = unaff_R13;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f94;
  pcVar10 = "key%d";
  pfVar11 = (fdb_kvs_handle *)local_338;
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x1174d4;
    sprintf((char *)pfVar11,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x1174dc;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x1174fa;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x117509;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if ((uint)unaff_RBP < 5) {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f85;
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00117f8a;
    pfStack_500 = (fdb_doc *)0x117529;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (uint)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  lVar14 = 0;
  do {
    pfStack_500 = (fdb_doc *)0x117544;
    fdb_set((fdb_kvs_handle *)local_4e8._8_8_,*(fdb_doc **)(local_338 + lVar14 * 8 + -0x28));
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  pfStack_500 = (fdb_doc *)0x117559;
  fdb_commit((fdb_file_handle *)local_4c8._0_8_,'\0');
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x11757e;
    sprintf(local_338,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x117586;
    sVar4 = strlen(local_338);
    pfStack_500 = (fdb_doc *)0x1175a4;
    fdb_doc_create((fdb_doc **)local_4e8,local_338,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x1175b3;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117ede;
    pfStack_500 = (fdb_doc *)0x1175c5;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x1175db;
  fdb_begin_transaction(local_4d0,'\x02');
  pfStack_500 = (fdb_doc *)0x1175ea;
  fdb_begin_transaction((fdb_file_handle *)local_4c8._16_8_,'\x02');
  uVar9 = 0;
  do {
    pfStack_500 = (fdb_doc *)0x117609;
    sprintf(local_338,"key%d",uVar9);
    unaff_RBP = local_228;
    pfStack_500 = (fdb_doc *)0x117625;
    sprintf((char *)unaff_RBP,"meta%d",uVar9);
    pcVar15 = local_488;
    pfStack_500 = (fdb_doc *)0x11763e;
    sprintf(pcVar15,"body%d_txn1",uVar9);
    pfStack_500 = (fdb_doc *)0x117646;
    sVar4 = strlen(local_338);
    pfStack_500 = (fdb_doc *)0x117651;
    sVar5 = strlen((char *)unaff_RBP);
    pfStack_500 = (fdb_doc *)0x11765c;
    sVar6 = strlen(pcVar15);
    pfStack_500 = (fdb_doc *)0x117681;
    fdb_doc_create((fdb_doc **)local_4e8,local_338,sVar4,unaff_RBP,sVar5,pcVar15,sVar6);
    pfStack_500 = (fdb_doc *)0x117690;
    fdb_set(local_4d8,(fdb_doc *)local_4e8._0_8_);
    pfStack_500 = (fdb_doc *)0x11769a;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    pfStack_500 = (fdb_doc *)0x1176ae;
    sprintf(pcVar15,"body%d_txn2",uVar9);
    pfStack_500 = (fdb_doc *)0x1176b6;
    sVar4 = strlen(local_338);
    pfStack_500 = (fdb_doc *)0x1176c1;
    sVar5 = strlen((char *)unaff_RBP);
    pfStack_500 = (fdb_doc *)0x1176cc;
    sVar6 = strlen(pcVar15);
    pfStack_500 = (fdb_doc *)0x1176e9;
    fdb_doc_create((fdb_doc **)local_4e8,local_338,sVar4,unaff_RBP,sVar5,pcVar15,sVar6);
    pfStack_500 = (fdb_doc *)0x1176f8;
    fdb_set((fdb_kvs_handle *)local_4c8._8_8_,(fdb_doc *)local_4e8._0_8_);
    pfStack_500 = (fdb_doc *)0x117702;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar13;
  } while (uVar13 != 10);
  unaff_R13 = (fdb_kvs_handle *)local_4e8;
  handle = (fdb_kvs_handle *)local_488;
  pcVar10 = (char *)0x0;
  do {
    pfVar11 = (fdb_kvs_handle *)local_338;
    pfStack_500 = (fdb_doc *)0x117736;
    sprintf((char *)pfVar11,"key%d",(ulong)pcVar10 & 0xffffffff);
    pfStack_500 = (fdb_doc *)0x11773e;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x11775c;
    fdb_doc_create((fdb_doc **)unaff_R13,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x11776b;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    unaff_R12 = (fdb_doc *)local_4e8._0_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117eee;
    unaff_RBP = *(fdb_doc **)(local_4e8._0_8_ + 0x40);
    pfVar7 = *(fdb_kvs_handle **)((&fStack_388.keylen)[(long)pcVar10] + 0x40);
    pfStack_500 = (fdb_doc *)0x11779f;
    iVar3 = bcmp(unaff_RBP,pfVar7,*(size_t *)(local_4e8._0_8_ + 0x10));
    pfVar11 = handle;
    if (iVar3 != 0) goto LAB_00117ee3;
    pfStack_500 = (fdb_doc *)0x1177af;
    fdb_doc_free(unaff_R12);
    pcVar15 = local_338;
    pfStack_500 = (fdb_doc *)0x1177bf;
    sVar4 = strlen(pcVar15);
    pfStack_500 = (fdb_doc *)0x1177e0;
    fdb_doc_create((fdb_doc **)unaff_R13,pcVar15,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x1177ef;
    fVar2 = fdb_get(local_4d8,(fdb_doc *)local_4e8._0_8_);
    pfVar7 = unaff_R13;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f00;
    pfStack_500 = (fdb_doc *)0x11780d;
    sprintf((char *)handle,"body%d_txn1",(ulong)pcVar10 & 0xffffffff);
    pcVar15 = (char *)local_4e8._0_8_;
    unaff_RBP = *(fdb_doc **)(local_4e8._0_8_ + 0x40);
    pfStack_500 = (fdb_doc *)0x117827;
    iVar3 = bcmp(unaff_RBP,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00117ef3;
    pfStack_500 = (fdb_doc *)0x117837;
    fdb_doc_free((fdb_doc *)pcVar15);
    pfVar11 = (fdb_kvs_handle *)local_338;
    pfStack_500 = (fdb_doc *)0x117847;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x117865;
    fdb_doc_create((fdb_doc **)unaff_R13,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x117874;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4c8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f12;
    pfStack_500 = (fdb_doc *)0x11788f;
    sprintf((char *)handle,"body%d_txn2",(ulong)pcVar10 & 0xffffffff);
    pcVar15 = (char *)local_4e8._0_8_;
    unaff_RBP = *(fdb_doc **)(local_4e8._0_8_ + 0x40);
    pfStack_500 = (fdb_doc *)0x1178a9;
    iVar3 = bcmp(unaff_RBP,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00117f05;
    pfStack_500 = (fdb_doc *)0x1178b9;
    fdb_doc_free((fdb_doc *)pcVar15);
    pcVar10 = (char *)((long)&((fdb_doc *)pcVar10)->keylen + 1);
  } while ((fdb_doc *)pcVar10 != (fdb_doc *)0xa);
  pfStack_500 = (fdb_doc *)0x1178d2;
  fdb_end_transaction((fdb_file_handle *)local_4c8._16_8_,'\0');
  pfVar11 = (fdb_kvs_handle *)local_338;
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  handle = (fdb_kvs_handle *)local_488;
  pcVar10 = (char *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x1178f9;
    sprintf((char *)pfVar11,"key%d",pcVar10);
    pfStack_500 = (fdb_doc *)0x117901;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x11791f;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x11792e;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f24;
    pfStack_500 = (fdb_doc *)0x117949;
    sprintf((char *)handle,"body%d_txn2",pcVar10);
    pcVar15 = (char *)local_4e8._0_8_;
    unaff_RBP = *(fdb_doc **)(local_4e8._0_8_ + 0x40);
    pfStack_500 = (fdb_doc *)0x117963;
    iVar3 = bcmp(unaff_RBP,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00117f17;
    pfStack_500 = (fdb_doc *)0x117973;
    fdb_doc_free((fdb_doc *)pcVar15);
    pfStack_500 = (fdb_doc *)0x11797b;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x117999;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x1179a8;
    fVar2 = fdb_get(local_4d8,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f36;
    pfStack_500 = (fdb_doc *)0x1179c3;
    sprintf((char *)handle,"body%d_txn1",pcVar10);
    pcVar15 = (char *)local_4e8._0_8_;
    unaff_RBP = *(fdb_doc **)(local_4e8._0_8_ + 0x40);
    pfStack_500 = (fdb_doc *)0x1179dd;
    iVar3 = bcmp(unaff_RBP,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00117f29;
    pfStack_500 = (fdb_doc *)0x1179ed;
    fdb_doc_free((fdb_doc *)pcVar15);
    uVar13 = (int)pcVar10 + 1;
    pcVar10 = (char *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x117a04;
  fdb_end_transaction(local_4d0,'\0');
  pfVar11 = (fdb_kvs_handle *)local_338;
  pcVar15 = "body%d_txn1";
  handle = (fdb_kvs_handle *)local_488;
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x117a2d;
    sprintf((char *)pfVar11,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x117a35;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x117a55;
    fdb_doc_create((fdb_doc **)local_4e8,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x117a64;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f48;
    pfStack_500 = (fdb_doc *)0x117a7b;
    sprintf((char *)handle,"body%d_txn1",unaff_RBP);
    pcVar10 = (char *)local_4e8._0_8_;
    pfVar7 = *(fdb_kvs_handle **)(local_4e8._0_8_ + 0x40);
    pfStack_500 = (fdb_doc *)0x117a93;
    iVar3 = bcmp(pfVar7,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00117f3b;
    pfStack_500 = (fdb_doc *)0x117aa3;
    fdb_doc_free((fdb_doc *)pcVar10);
    uVar13 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x117abd;
  fdb_begin_transaction(local_4d0,'\x02');
  pfStack_500 = (fdb_doc *)0x117adb;
  sprintf((char *)local_338,"key%d",5);
  pfVar7 = (fdb_kvs_handle *)local_228;
  pfStack_500 = (fdb_doc *)0x117af9;
  sprintf((char *)pfVar7,"meta%d",5);
  pcVar15 = local_488;
  pfStack_500 = (fdb_doc *)0x117b14;
  sprintf(pcVar15,"body%d_before_compaction",5);
  pfStack_500 = (fdb_doc *)0x117b1c;
  handle = (fdb_kvs_handle *)strlen((char *)local_338);
  pfStack_500 = (fdb_doc *)0x117b27;
  unaff_RBP = (fdb_doc *)strlen((char *)pfVar7);
  pfStack_500 = (fdb_doc *)0x117b32;
  sVar4 = strlen(pcVar15);
  pfVar11 = (fdb_kvs_handle *)local_4e8;
  pfStack_500 = (fdb_doc *)0x117b52;
  fdb_doc_create((fdb_doc **)pfVar11,(fdb_doc *)local_338,(size_t)handle,pfVar7,(size_t)unaff_RBP,
                 pcVar15,sVar4);
  pfStack_500 = (fdb_doc *)0x117b5f;
  fdb_set(local_4d8,(fdb_doc *)local_4e8._0_8_);
  pfStack_500 = (fdb_doc *)0x117b67;
  fdb_doc_free((fdb_doc *)local_4e8._0_8_);
  pfStack_500 = (fdb_doc *)0x117b78;
  fdb_compact((fdb_file_handle *)local_4c8._0_8_,"mvcc_test2");
  pfStack_500 = (fdb_doc *)0x117b80;
  sVar4 = strlen((char *)local_338);
  pfStack_500 = (fdb_doc *)0x117b9e;
  fdb_doc_create((fdb_doc **)pfVar11,(fdb_doc *)local_338,sVar4,(void *)0x0,0,(void *)0x0,0);
  pfStack_500 = (fdb_doc *)0x117bab;
  fVar2 = fdb_get(local_4d8,(fdb_doc *)local_4e8._0_8_);
  pcVar10 = (char *)local_4e8._0_8_;
  pfVar8 = (fdb_doc *)local_338;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f99;
  pfVar11 = *(fdb_kvs_handle **)(local_4e8._0_8_ + 0x40);
  pfStack_500 = (fdb_doc *)0x117bcd;
  iVar3 = bcmp(pfVar11,local_488,*(size_t *)(local_4e8._0_8_ + 0x10));
  if (iVar3 != 0) goto LAB_00117f9e;
  pfStack_500 = (fdb_doc *)0x117bdd;
  fdb_doc_free((fdb_doc *)pcVar10);
  pcVar10 = local_338;
  pfStack_500 = (fdb_doc *)0x117bed;
  sVar4 = strlen(pcVar10);
  pfVar11 = (fdb_kvs_handle *)local_4e8;
  pfStack_500 = (fdb_doc *)0x117c10;
  fdb_doc_create((fdb_doc **)pfVar11,pcVar10,sVar4,(void *)0x0,0,(void *)0x0,0);
  pfStack_500 = (fdb_doc *)0x117c1d;
  fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117fab;
  pfVar7 = (fdb_kvs_handle *)local_488;
  pfStack_500 = (fdb_doc *)0x117c40;
  sprintf((char *)pfVar7,"body%d_txn1",5);
  pcVar10 = (char *)local_4e8._0_8_;
  pfVar11 = *(fdb_kvs_handle **)(local_4e8._0_8_ + 0x40);
  pfStack_500 = (fdb_doc *)0x117c58;
  iVar3 = bcmp(pfVar11,pfVar7,*(size_t *)(local_4e8._0_8_ + 0x10));
  if (iVar3 != 0) goto LAB_00117fb0;
  pfStack_500 = (fdb_doc *)0x117c68;
  fdb_doc_free((fdb_doc *)pcVar10);
  pfStack_500 = (fdb_doc *)0x117c74;
  fdb_end_transaction(local_4d0,'\0');
  pfVar11 = (fdb_kvs_handle *)local_338;
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  handle = (fdb_kvs_handle *)local_488;
  pcVar15 = (char *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x117c9d;
    sprintf((char *)pfVar11,"key%d",pcVar15);
    pfStack_500 = (fdb_doc *)0x117ca5;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x117cc3;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x117cd2;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f5a;
    if ((int)pcVar15 == 5) {
      pcVar10 = "body%d_before_compaction";
      pfVar8 = (fdb_doc *)0x5;
    }
    else {
      pcVar10 = "body%d_txn1";
      pfVar8 = (fdb_doc *)pcVar15;
    }
    pfStack_500 = (fdb_doc *)0x117d02;
    sprintf((char *)handle,pcVar10,pfVar8);
    unaff_RBP = (fdb_doc *)local_4e8._0_8_;
    pcVar10 = *(char **)(local_4e8._0_8_ + 0x40);
    pfStack_500 = (fdb_doc *)0x117d1a;
    iVar3 = bcmp(pcVar10,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00117f4d;
    pfStack_500 = (fdb_doc *)0x117d2a;
    fdb_doc_free(unaff_RBP);
    uVar13 = (int)pcVar15 + 1;
    pcVar15 = (char *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x117d44;
  fdb_close((fdb_file_handle *)local_4c8._0_8_);
  pfStack_500 = (fdb_doc *)0x117d5b;
  fdb_open((fdb_file_handle **)local_4c8,"mvcc_test2",&local_128);
  pcVar10 = local_4e8 + 8;
  pfStack_500 = (fdb_doc *)0x117d70;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_4c8._0_8_,(fdb_kvs_handle **)pcVar10,
             (fdb_kvs_config *)local_4a0);
  pfStack_500 = (fdb_doc *)0x117d86;
  fVar2 = fdb_set_log_callback((fdb_kvs_handle *)local_4e8._8_8_,logCallbackFunc,"transaction_test")
  ;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar11 = (fdb_kvs_handle *)local_338;
    pfVar7 = (fdb_kvs_handle *)local_4e8;
    handle = (fdb_kvs_handle *)local_488;
    pcVar15 = (char *)0x0;
    while( true ) {
      pfStack_500 = (fdb_doc *)0x117db7;
      sprintf((char *)pfVar11,"key%d",pcVar15);
      pfStack_500 = (fdb_doc *)0x117dbf;
      sVar4 = strlen((char *)pfVar11);
      pfStack_500 = (fdb_doc *)0x117ddd;
      fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
      pfStack_500 = (fdb_doc *)0x117dec;
      fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      if ((int)pcVar15 == 5) {
        pcVar10 = "body%d_before_compaction";
        pfVar8 = (fdb_doc *)0x5;
      }
      else {
        pcVar10 = "body%d_txn1";
        pfVar8 = (fdb_doc *)pcVar15;
      }
      pfStack_500 = (fdb_doc *)0x117e1c;
      sprintf((char *)handle,pcVar10,pfVar8);
      unaff_RBP = (fdb_doc *)local_4e8._0_8_;
      pcVar10 = *(char **)(local_4e8._0_8_ + 0x40);
      pfStack_500 = (fdb_doc *)0x117e34;
      iVar3 = bcmp(pcVar10,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_00117f5f;
      pfStack_500 = (fdb_doc *)0x117e44;
      fdb_doc_free(unaff_RBP);
      uVar13 = (int)pcVar15 + 1;
      pcVar15 = (char *)(ulong)uVar13;
      if (uVar13 == 10) {
        pfStack_500 = (fdb_doc *)0x117e5b;
        fdb_close((fdb_file_handle *)local_4c8._0_8_);
        pfStack_500 = (fdb_doc *)0x117e65;
        fdb_close(local_4d0);
        pfStack_500 = (fdb_doc *)0x117e6f;
        fdb_close((fdb_file_handle *)local_4c8._16_8_);
        lVar14 = 0;
        do {
          pfStack_500 = (fdb_doc *)0x117e7e;
          fdb_doc_free((fdb_doc *)(&fStack_388.keylen)[lVar14]);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 10);
        pfStack_500 = (fdb_doc *)0x117e8c;
        fdb_shutdown();
        pfStack_500 = (fdb_doc *)0x117e91;
        memleak_end();
        pcVar10 = "%s PASSED\n";
        if (transaction_test()::__test_pass != '\0') {
          pcVar10 = "%s FAILED\n";
        }
        pfStack_500 = (fdb_doc *)0x117ec2;
        fprintf(_stderr,pcVar10,"transaction test");
        return;
      }
    }
    goto LAB_00117f6c;
  }
  goto LAB_00117fbd;
LAB_001185e9:
  pfStack_898 = (fdb_doc *)0x1185f6;
  transaction_simple_api_test();
  pfVar11 = pfVar7;
LAB_001185f6:
  pfStack_898 = (fdb_doc *)0x1185fb;
  transaction_simple_api_test();
LAB_001185fb:
  pfStack_898 = (fdb_doc *)0x118608;
  transaction_simple_api_test();
  pfVar7 = pfVar11;
LAB_00118608:
  pfStack_898 = (fdb_doc *)0x11860d;
  transaction_simple_api_test();
LAB_0011860d:
  pfStack_898 = (fdb_doc *)0x11861a;
  transaction_simple_api_test();
  pfVar12 = pfVar7;
LAB_0011861a:
  pfStack_898 = (fdb_doc *)0x11861f;
  transaction_simple_api_test();
LAB_0011861f:
  pfStack_898 = (fdb_doc *)0x11862c;
  transaction_simple_api_test();
  pfVar7 = pfVar12;
LAB_0011862c:
  pfVar12 = pfVar7;
  pfStack_898 = (fdb_doc *)0x118631;
  transaction_simple_api_test();
LAB_00118631:
  pfStack_898 = (fdb_doc *)0x118636;
  transaction_simple_api_test();
LAB_00118636:
  pfVar11 = pfVar12;
  pfStack_898 = (fdb_doc *)0x11863b;
  transaction_simple_api_test();
LAB_0011863b:
  pfStack_898 = (fdb_doc *)0x118648;
  transaction_simple_api_test();
LAB_00118648:
  pfVar12 = (fdb_kvs_handle *)auStack_820;
  pfStack_898 = (fdb_doc *)0x118655;
  transaction_simple_api_test();
  pfVar7 = (fdb_kvs_handle *)pcVar15;
  goto LAB_00118655;
LAB_00117ed9:
  pfStack_500 = (fdb_doc *)0x117ede;
  transaction_test();
LAB_00117ede:
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  pfVar11 = (fdb_kvs_handle *)local_338;
  pcVar10 = "key%d";
  pfStack_500 = (fdb_doc *)0x117ee3;
  transaction_test();
LAB_00117ee3:
  pfStack_500 = (fdb_doc *)0x117eee;
  transaction_test();
  pcVar15 = (char *)unaff_R12;
  handle = unaff_R13;
  unaff_R13 = pfVar7;
LAB_00117eee:
  pfStack_500 = (fdb_doc *)0x117ef3;
  transaction_test();
LAB_00117ef3:
  pfStack_500 = (fdb_doc *)0x117f00;
  transaction_test();
  pfVar7 = handle;
LAB_00117f00:
  handle = pfVar7;
  pfStack_500 = (fdb_doc *)0x117f05;
  transaction_test();
  pfVar7 = unaff_R13;
LAB_00117f05:
  pfStack_500 = (fdb_doc *)0x117f12;
  transaction_test();
LAB_00117f12:
  pfStack_500 = (fdb_doc *)0x117f17;
  transaction_test();
LAB_00117f17:
  pfStack_500 = (fdb_doc *)0x117f24;
  transaction_test();
LAB_00117f24:
  pfStack_500 = (fdb_doc *)0x117f29;
  transaction_test();
LAB_00117f29:
  pfStack_500 = (fdb_doc *)0x117f36;
  transaction_test();
LAB_00117f36:
  pfStack_500 = (fdb_doc *)0x117f3b;
  transaction_test();
LAB_00117f3b:
  pfStack_500 = (fdb_doc *)0x117f48;
  transaction_test();
LAB_00117f48:
  pfStack_500 = (fdb_doc *)0x117f4d;
  transaction_test();
LAB_00117f4d:
  pfStack_500 = (fdb_doc *)0x117f5a;
  transaction_test();
LAB_00117f5a:
  pfStack_500 = (fdb_doc *)0x117f5f;
  transaction_test();
LAB_00117f5f:
  pfStack_500 = (fdb_doc *)0x117f6c;
  transaction_test();
LAB_00117f6c:
  pfStack_500 = (fdb_doc *)0x117f71;
  transaction_test();
  unaff_R12 = (fdb_doc *)pcVar15;
  unaff_R13 = handle;
LAB_00117f71:
  pfStack_500 = (fdb_doc *)0x117f76;
  transaction_test();
LAB_00117f76:
  pfStack_500 = (fdb_doc *)0x117f7b;
  transaction_test();
LAB_00117f7b:
  pfStack_500 = (fdb_doc *)0x117f80;
  transaction_test();
LAB_00117f80:
  pfStack_500 = (fdb_doc *)0x117f85;
  transaction_test();
LAB_00117f85:
  pfStack_500 = (fdb_doc *)0x117f8a;
  transaction_test();
LAB_00117f8a:
  pfStack_500 = (fdb_doc *)0x117f8f;
  transaction_test();
LAB_00117f8f:
  pfStack_500 = (fdb_doc *)0x117f94;
  transaction_test();
  pcVar15 = (char *)unaff_R12;
  handle = unaff_R13;
LAB_00117f94:
  pfStack_500 = (fdb_doc *)0x117f99;
  transaction_test();
  pfVar8 = (fdb_doc *)pcVar10;
LAB_00117f99:
  pcVar10 = (char *)pfVar8;
  pfStack_500 = (fdb_doc *)0x117f9e;
  transaction_test();
LAB_00117f9e:
  pfStack_500 = (fdb_doc *)0x117fab;
  transaction_test();
LAB_00117fab:
  pfStack_500 = (fdb_doc *)0x117fb0;
  transaction_test();
LAB_00117fb0:
  pfStack_500 = (fdb_doc *)0x117fbd;
  transaction_test();
LAB_00117fbd:
  pfStack_500 = (fdb_doc *)transaction_simple_api_test;
  transaction_test();
  pfStack_898 = (fdb_doc *)0x117fdf;
  pfStack_528 = (fdb_doc *)pcVar10;
  pfStack_520 = (fdb_doc *)pcVar15;
  pfStack_518 = handle;
  pfStack_510 = pfVar11;
  pfStack_508 = pfVar7;
  pfStack_500 = unaff_RBP;
  gettimeofday(&tStack_830,(__timezone_ptr_t)0x0);
  pfStack_898 = (fdb_doc *)0x117fe4;
  memleak_start();
  pfStack_898 = (fdb_doc *)0x117ff0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_898 = (fdb_doc *)0x118000;
  fdb_get_default_config();
  config = &fStack_848;
  pfStack_898 = (fdb_doc *)0x11800d;
  fdb_get_default_kvs_config();
  fStack_620.buffercache_size = 0;
  fStack_620.wal_threshold = 0x400;
  fStack_620.flags = 1;
  fStack_620.purging_interval = 0;
  fStack_620.compaction_threshold = '\0';
  pfVar7 = (fdb_kvs_handle *)&pbStack_850;
  pfStack_898 = (fdb_doc *)0x118046;
  fdb_open((fdb_file_handle **)pfVar7,"./mvcc_test1",&fStack_620);
  pfVar11 = (fdb_kvs_handle *)(auStack_880 + 8);
  pfStack_898 = (fdb_doc *)0x118059;
  fdb_kvs_open_default((fdb_file_handle *)pbStack_850,(fdb_kvs_handle **)pfVar11,config);
  pfStack_898 = (fdb_doc *)0x11806f;
  pfVar12 = (fdb_kvs_handle *)auStack_880._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_880._8_8_,logCallbackFunc,
                     "transaction_simple_api_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar10 = auStack_820 + 0x100;
    pcVar15 = "body%d";
    unaff_RBP = (fdb_doc *)0x0;
    do {
      pfStack_898 = (fdb_doc *)0x1180a0;
      sprintf(pcVar10,"key%d",unaff_RBP);
      pfStack_898 = (fdb_doc *)0x1180af;
      sprintf(auStack_820,"body%d",unaff_RBP);
      handle = (fdb_kvs_handle *)auStack_880._8_8_;
      pfStack_898 = (fdb_doc *)0x1180bc;
      pfVar7 = (fdb_kvs_handle *)strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x1180c7;
      sVar4 = strlen(auStack_820);
      pfStack_898 = (fdb_doc *)0x1180db;
      fVar2 = fdb_set_kv(handle,pcVar10,(size_t)pfVar7,auStack_820,sVar4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_898 = (fdb_doc *)0x1185e9;
        transaction_simple_api_test();
        goto LAB_001185e9;
      }
      uVar13 = (int)unaff_RBP + 1;
      unaff_RBP = (fdb_doc *)(ulong)uVar13;
    } while (uVar13 != 10);
    pfStack_898 = (fdb_doc *)0x1180f6;
    fdb_commit((fdb_file_handle *)pbStack_850,'\0');
    pfStack_898 = (fdb_doc *)0x118118;
    fdb_open((fdb_file_handle **)&phStack_858,"./mvcc_test1",&fStack_620);
    pfStack_898 = (fdb_doc *)0x11812b;
    fdb_open(&pfStack_860,"./mvcc_test1",&fStack_620);
    pfStack_898 = (fdb_doc *)0x118140;
    fdb_kvs_open_default((fdb_file_handle *)phStack_858,&pfStack_868,&fStack_848);
    pfStack_898 = (fdb_doc *)0x118151;
    fdb_kvs_open_default(pfStack_860,&pfStack_870,&fStack_848);
    pfStack_898 = (fdb_doc *)0x11815e;
    fdb_begin_transaction((fdb_file_handle *)phStack_858,'\x02');
    pfStack_898 = (fdb_doc *)0x11816c;
    fdb_begin_transaction(pfStack_860,'\x02');
    pcVar10 = auStack_820 + 0x100;
    uVar13 = 0;
    do {
      pfStack_898 = (fdb_doc *)0x118191;
      sprintf(pcVar10,"key%d",(ulong)uVar13);
      pfStack_898 = (fdb_doc *)0x1181a4;
      sprintf(auStack_820,"body%d_txn1",(ulong)uVar13);
      pfVar7 = pfStack_868;
      pfStack_898 = (fdb_doc *)0x1181b1;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x1181bc;
      sVar5 = strlen(auStack_820);
      pfStack_898 = (fdb_doc *)0x1181d0;
      fdb_set_kv(pfVar7,pcVar10,sVar4,auStack_820,sVar5);
      pfStack_898 = (fdb_doc *)0x1181df;
      sprintf(pcVar10,"key%d",(ulong)uVar13);
      pfStack_898 = (fdb_doc *)0x1181f2;
      sprintf(auStack_820,"body%d_txn2",(ulong)uVar13);
      pfVar7 = pfStack_870;
      pfStack_898 = (fdb_doc *)0x1181ff;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x11820a;
      sVar5 = strlen(auStack_820);
      pfStack_898 = (fdb_doc *)0x11821e;
      fdb_set_kv(pfVar7,pcVar10,sVar4,auStack_820,sVar5);
      uVar13 = uVar13 + 1;
    } while (uVar13 != 10);
    pcVar10 = auStack_820 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_888;
    unaff_RBP = (fdb_doc *)auStack_880;
    pcVar15 = (char *)0x0;
    do {
      pfStack_898 = (fdb_doc *)0x118257;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_898 = (fdb_doc *)0x11826b;
      sprintf(auStack_820,"body%d",pcVar15);
      pfVar11 = (fdb_kvs_handle *)auStack_880._8_8_;
      pfStack_898 = (fdb_doc *)0x118278;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x11828c;
      fVar2 = fdb_get_kv(pfVar11,pcVar10,sVar4,(void **)handle,(size_t *)unaff_RBP);
      pfVar7 = pfStack_888;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001185f6;
      pfStack_898 = (fdb_doc *)0x1182a9;
      iVar3 = bcmp(pfStack_888,auStack_820,auStack_880._0_8_);
      if (iVar3 != 0) goto LAB_001185e9;
      pfStack_898 = (fdb_doc *)0x1182b9;
      fdb_free_block(pfVar7);
      pfStack_898 = (fdb_doc *)0x1182cd;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_898 = (fdb_doc *)0x1182e1;
      sprintf(auStack_820,"body%d_txn1",pcVar15);
      pfVar7 = pfStack_868;
      pfStack_898 = (fdb_doc *)0x1182ee;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x118302;
      fVar2 = fdb_get_kv(pfVar7,pcVar10,sVar4,(void **)handle,(size_t *)unaff_RBP);
      pfVar11 = pfStack_888;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00118608;
      pfStack_898 = (fdb_doc *)0x11831f;
      iVar3 = bcmp(pfStack_888,auStack_820,auStack_880._0_8_);
      if (iVar3 != 0) goto LAB_001185fb;
      pfStack_898 = (fdb_doc *)0x11832f;
      fdb_free_block(pfVar11);
      pfStack_898 = (fdb_doc *)0x118343;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_898 = (fdb_doc *)0x118357;
      sprintf(auStack_820,"body%d_txn2",pcVar15);
      pfVar12 = pfStack_870;
      pfStack_898 = (fdb_doc *)0x118364;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x118378;
      fVar2 = fdb_get_kv(pfVar12,pcVar10,sVar4,(void **)handle,(size_t *)unaff_RBP);
      pfVar7 = pfStack_888;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011861a;
      pfStack_898 = (fdb_doc *)0x118395;
      iVar3 = bcmp(pfStack_888,auStack_820,auStack_880._0_8_);
      if (iVar3 != 0) goto LAB_0011860d;
      pfStack_898 = (fdb_doc *)0x1183a5;
      fdb_free_block(pfVar7);
      uVar13 = (int)pcVar15 + 1;
      pcVar15 = (char *)(ulong)uVar13;
    } while (uVar13 != 10);
    pfStack_898 = (fdb_doc *)0x1183be;
    fdb_end_transaction((fdb_file_handle *)phStack_858,'\0');
    pcVar10 = auStack_820 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_888;
    unaff_RBP = (fdb_doc *)auStack_880;
    pcVar15 = (char *)0x0;
    do {
      pfStack_898 = (fdb_doc *)0x1183ec;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_898 = (fdb_doc *)0x118400;
      sprintf(auStack_820,"body%d_txn1",pcVar15);
      pfVar7 = (fdb_kvs_handle *)auStack_880._8_8_;
      pfStack_898 = (fdb_doc *)0x11840d;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x118421;
      fVar2 = fdb_get_kv(pfVar7,pcVar10,sVar4,(void **)handle,(size_t *)unaff_RBP);
      pfVar12 = pfStack_888;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011862c;
      pfStack_898 = (fdb_doc *)0x11843e;
      iVar3 = bcmp(pfStack_888,auStack_820,auStack_880._0_8_);
      if (iVar3 != 0) goto LAB_0011861f;
      pfStack_898 = (fdb_doc *)0x11844e;
      fVar2 = fdb_free_block(pfVar12);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00118631;
      pfStack_898 = (fdb_doc *)0x11846a;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_898 = (fdb_doc *)0x11847e;
      sprintf(auStack_820,"body%d_txn2",pcVar15);
      pfVar12 = pfStack_870;
      pfStack_898 = (fdb_doc *)0x11848b;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x11849f;
      fVar2 = fdb_get_kv(pfVar12,pcVar10,sVar4,(void **)handle,(size_t *)unaff_RBP);
      pfVar11 = pfStack_888;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00118636;
      pfStack_898 = (fdb_doc *)0x1184bc;
      iVar3 = bcmp(pfStack_888,auStack_820,auStack_880._0_8_);
      if (iVar3 != 0) goto LAB_0011863b;
      pfStack_898 = (fdb_doc *)0x1184cc;
      fdb_free_block(pfVar11);
      uVar13 = (int)pcVar15 + 1;
      pcVar15 = (char *)(ulong)uVar13;
    } while (uVar13 != 10);
    pfStack_898 = (fdb_doc *)0x1184e5;
    fdb_end_transaction(pfStack_860,'\0');
    pcVar10 = auStack_820 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_888;
    unaff_RBP = (fdb_doc *)auStack_880;
    pfVar11 = (fdb_kvs_handle *)0x0;
    while( true ) {
      pfStack_898 = (fdb_doc *)0x118511;
      sprintf(pcVar10,"key%d",pfVar11);
      pfStack_898 = (fdb_doc *)0x118524;
      sprintf(auStack_820,"body%d_txn2",pfVar11);
      pfVar7 = (fdb_kvs_handle *)auStack_880._8_8_;
      pfStack_898 = (fdb_doc *)0x118531;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x118545;
      pfVar12 = pfVar7;
      fVar2 = fdb_get_kv(pfVar7,pcVar10,sVar4,(void **)handle,(size_t *)unaff_RBP);
      pcVar15 = (char *)pfStack_888;
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      pfStack_898 = (fdb_doc *)0x118562;
      iVar3 = bcmp(pfStack_888,auStack_820,auStack_880._0_8_);
      if (iVar3 != 0) goto LAB_00118648;
      pfStack_898 = (fdb_doc *)0x118572;
      fdb_free_block(pcVar15);
      uVar13 = (int)pfVar11 + 1;
      pfVar11 = (fdb_kvs_handle *)(ulong)uVar13;
      if (uVar13 == 10) {
        pfStack_898 = (fdb_doc *)0x118583;
        fdb_close((fdb_file_handle *)pbStack_850);
        pfStack_898 = (fdb_doc *)0x11858d;
        fdb_close((fdb_file_handle *)phStack_858);
        pfStack_898 = (fdb_doc *)0x118597;
        fdb_close(pfStack_860);
        pfStack_898 = (fdb_doc *)0x11859c;
        fdb_shutdown();
        pfStack_898 = (fdb_doc *)0x1185a1;
        memleak_end();
        pcVar10 = "%s PASSED\n";
        if (transaction_simple_api_test()::__test_pass != '\0') {
          pcVar10 = "%s FAILED\n";
        }
        pfStack_898 = (fdb_doc *)0x1185d2;
        fprintf(_stderr,pcVar10,"transaction simple API test");
        return;
      }
    }
LAB_00118655:
    config = (fdb_kvs_config *)(auStack_820 + 0x100);
    pcVar15 = auStack_820;
    pfStack_898 = (fdb_doc *)0x11865a;
    transaction_simple_api_test();
  }
  pfStack_898 = (fdb_doc *)in_memory_snapshot_thread;
  transaction_simple_api_test();
  pfStack_8c0 = pfVar11;
  pfStack_8b8 = (fdb_doc *)pcVar15;
  pfStack_8b0 = handle;
  pfStack_8a8 = config;
  pfStack_8a0 = pfVar7;
  pfStack_898 = unaff_RBP;
  gettimeofday(&tStack_ad8,(__timezone_ptr_t)0x0);
  fVar2 = fdb_snapshot_open(pfVar12,&pfStack_ae0,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdb6);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdb6,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_iterator_init(pfStack_ae0,&pfStack_af0,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdba);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdba,"void *in_memory_snapshot_thread(void *)");
  }
  uVar9 = 0;
  do {
    uVar13 = (uint)uVar9;
    pfStack_ae8 = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_get(pfStack_af0,&pfStack_ae8);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    sprintf(acStack_9c8,"key%d",uVar9);
    sprintf(acStack_ac8,"body%d",uVar9);
    pfVar8 = pfStack_ae8;
    pvVar1 = pfStack_ae8->key;
    iVar3 = bcmp(pvVar1,acStack_9c8,pfStack_ae8->keylen);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_9c8,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc4);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc4,"void *in_memory_snapshot_thread(void *)");
    }
    pvVar1 = pfVar8->body;
    iVar3 = bcmp(pvVar1,acStack_ac8,pfVar8->bodylen);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_ac8,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc5);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc5,"void *in_memory_snapshot_thread(void *)");
    }
    uVar13 = uVar13 + 1;
    uVar9 = (ulong)uVar13;
    fdb_doc_free(pfVar8);
    fVar2 = fdb_iterator_next(pfStack_af0);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  if (uVar13 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdc9);
    __assert_fail("i == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdc9,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_iterator_close(pfStack_af0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdcc);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdcc,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_kvs_close(pfStack_ae0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdce);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdce,"void *in_memory_snapshot_thread(void *)");
  }
  pthread_exit((void *)0x0);
}

Assistant:

void transaction_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile, *dbfile_txn1, *dbfile_txn2, *dbfile_txn3;
    fdb_kvs_handle *db, *db_txn1, *db_txn2, *db_txn3;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open db and begin transactions
    fdb_open(&dbfile_txn1, "mvcc_test1", &fconfig);
    fdb_open(&dbfile_txn2, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);

    // insert half docs into txn1
    for (i=0;i<n/2;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn1, doc[i]);
    }

    // insert other half docs into txn2
    for (i=n/2;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn2, doc[i]);
    }

    // uncommitted docs should not be read by the other transaction that
    // doesn't allow uncommitted reads.
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn1, rdoc);
        if (i<n/2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
    }

    // uncommitted docs can be read by the transaction that allows uncommitted reads.
    fdb_open(&dbfile_txn3, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn3, &db_txn3, &kvs_config);
    fdb_begin_transaction(dbfile_txn3, FDB_ISOLATION_READ_UNCOMMITTED);
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn3, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }
    fdb_end_transaction(dbfile_txn3, FDB_COMMIT_NORMAL);
    fdb_close(dbfile_txn3);

    // commit and end txn1
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);

    // uncommitted docs should not be read generally
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<n/2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
    }

    // read uncommitted docs using the same transaction
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }

    // abort txn2
    fdb_abort_transaction(dbfile_txn2);

    // close & re-open db file
    fdb_close(dbfile);
    fdb_open(&dbfile, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // uncommitted docs should not be read after reopening the file either
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<n/2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
    }

    // insert other half docs & commit
    for (i=n/2;i<n;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // now all docs can be read generally
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }

    // begin transactions
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);

    // concurrently update docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn1, rdoc);
        fdb_doc_free(rdoc);

        sprintf(bodybuf, "body%d_txn2", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn2, rdoc);
        fdb_doc_free(rdoc);
    }

    // retrieve check
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);

        // get from txn1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn1", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);

        // get from txn2
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn2", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // commit txn2 & retrieve check
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn2", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);

        // get from txn1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn1", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // commit txn1 & retrieve check
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn1", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // begin new transaction
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    // update doc#5
    i = 5;
    sprintf(keybuf, "key%d", i);
    sprintf(metabuf, "meta%d", i);
    sprintf(bodybuf, "body%d_before_compaction", i);
    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                            (void*)metabuf, strlen(metabuf),
                            (void*)bodybuf, strlen(bodybuf));
    fdb_set(db_txn1, rdoc);
    fdb_doc_free(rdoc);

    // do compaction
    fdb_compact(dbfile, "mvcc_test2");

    // retrieve doc#5
    // using txn1
    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
    status = fdb_get(db_txn1, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
    fdb_doc_free(rdoc);

    // general retrieval
    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    sprintf(bodybuf, "body%d_txn1", i);
    TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
    fdb_doc_free(rdoc);

    // commit transaction
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);
    // retrieve check
    for (i=0;i<n;++i){
        // general get
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (i != 5) {
            sprintf(bodybuf, "body%d_txn1", i);
        } else {
            sprintf(bodybuf, "body%d_before_compaction", i);
        }
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // close & re-open db file
    fdb_close(dbfile);
    fdb_open(&dbfile, "mvcc_test2", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // retrieve check again
    for (i=0;i<n;++i){
        // general get
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (i != 5) {
            sprintf(bodybuf, "body%d_txn1", i);
        } else {
            sprintf(bodybuf, "body%d_before_compaction", i);
        }
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("transaction test");
}